

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O0

void __thiscall CJSON::AddPair<double>(CJSON *this,string *Name,double *val)

{
  bool bVar1;
  CJSONException *this_00;
  mapped_type *this_01;
  string local_a0;
  undefined1 local_7d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  _Self local_30;
  _Self local_28;
  double *local_20;
  double *val_local;
  string *Name_local;
  CJSON *this_local;
  
  local_20 = val;
  val_local = (double *)Name;
  Name_local = (string *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->m_Values,Name);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->m_Values);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (!bVar1) {
    ValueToString<double,_nullptr>(&local_a0,this,local_20);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->m_Values,(key_type *)val_local);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    return;
  }
  local_7d = 1;
  this_00 = (CJSONException *)__cxa_allocate_exception(0x30);
  std::operator+(&local_70,"Name \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_local);
  std::operator+(&local_50,&local_70,"\' already exists!");
  CJSONException::CJSONException(this_00,&local_50,NAME_ALREADY_EXITS);
  local_7d = 0;
  __cxa_throw(this_00,&CJSONException::typeinfo,CJSONException::~CJSONException);
}

Assistant:

inline void AddPair(const std::string &Name, const T &val)
        {
            if(m_Values.find(Name) != m_Values.end())
                throw CJSONException("Name '" + Name + "' already exists!", JSONErrorType::NAME_ALREADY_EXITS);

            m_Values[Name] = ValueToString(val); 
        }